

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLcode Curl_getformdata(Curl_easy *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  ulong uVar1;
  byte *__filename;
  FormData *pFVar2;
  FormData **ppFVar3;
  long *plVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  uint uVar7;
  int iVar8;
  FILE *__stream;
  size_t length;
  FormData *pFVar9;
  char *pcVar10;
  curl_off_t *pcVar11;
  curl_off_t length_00;
  formtype type;
  curl_httppost *file;
  curl_httppost *pcVar12;
  curl_slist *pcVar13;
  curl_off_t size;
  FormData *form;
  char fileboundary [42];
  char boundary [42];
  char buffer [512];
  curl_off_t local_2d0;
  FormData *local_2c8;
  FormData **local_2c0;
  Curl_easy *local_2b8;
  long *local_2b0;
  curl_off_t *local_2a8;
  curl_off_t *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  uchar local_280 [24];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  uchar local_250 [24];
  undefined1 local_238 [520];
  
  CVar5 = CURLE_OK;
  local_2c8 = (FormData *)0x0;
  local_2d0 = 0;
  *finalform = (FormData *)0x0;
  if (post != (curl_httppost *)0x0) {
    local_258 = 0x2d2d2d2d2d2d2d2d;
    local_268 = 0x2d2d2d2d2d2d2d2d;
    uStack_260 = 0x2d2d2d2d2d2d2d2d;
    Curl_rand_hex(data,local_250,0x11);
    pcVar10 = "Content-Type: multipart/form-data";
    if (custom_content_type != (char *)0x0) {
      pcVar10 = custom_content_type;
    }
    CVar5 = AddFormDataf(&local_2c8,(curl_off_t *)0x0,"%s; boundary=%s\r\n",pcVar10,&local_268);
    pFVar2 = local_2c8;
    local_2b8 = data;
    local_2b0 = sizep;
    if (CVar5 == CURLE_OK) {
      do {
        if (((((local_2d0 != 0) &&
              (CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\n"), CVar6 != CURLE_OK)) ||
             (CVar6 = AddFormDataf(&local_2c8,&local_2d0,"--%s\r\n",&local_268), CVar6 != CURLE_OK))
            || ((CVar6 = AddFormDataf(&local_2c8,&local_2d0,
                                      "Content-Disposition: form-data; name=\""), CVar6 != CURLE_OK
                || (CVar6 = AddFormData(&local_2c8,FORM_DATA,post->name,post->namelength,&local_2d0)
                   , CVar6 != CURLE_OK)))) ||
           (CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\""), CVar6 != CURLE_OK))
        goto joined_r0x0051249d;
        if (post->more != (curl_httppost *)0x0) {
          local_288 = 0x2d2d2d2d2d2d2d2d;
          local_298 = 0x2d2d2d2d2d2d2d2d;
          uStack_290 = 0x2d2d2d2d2d2d2d2d;
          Curl_rand_hex(local_2b8,local_280,0x11);
          CVar6 = AddFormDataf(&local_2c8,&local_2d0,
                               "\r\nContent-Type: multipart/mixed; boundary=%s\r\n",&local_298);
          if (CVar6 != CURLE_OK) goto joined_r0x0051249d;
        }
        local_2a0 = &post->contentlen;
        local_2a8 = &post->contentslength;
        pcVar12 = post;
        local_2c0 = finalform;
        do {
          if (post->more == (curl_httppost *)0x0) {
            if (((post->flags & 0x51U) != 0) &&
               ((file = post, (post->flags & 1U) != 0 || (post->showfilename != (char *)0x0))))
            goto LAB_005121cd;
          }
          else {
            CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\n--%s\r\nContent-Disposition: attachment"
                                 ,&local_298);
            file = pcVar12;
            if (CVar6 != CURLE_OK) goto joined_r0x0051249d;
LAB_005121cd:
            CVar6 = formdata_add_filename(file,&local_2c8,&local_2d0);
            if (CVar6 != CURLE_OK) goto joined_r0x0051249d;
          }
          if ((pcVar12->contenttype != (char *)0x0) &&
             (CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\nContent-Type: %s"), CVar6 != CURLE_OK)
             ) goto joined_r0x0051249d;
          for (pcVar13 = pcVar12->contentheader; pcVar13 != (curl_slist *)0x0;
              pcVar13 = pcVar13->next) {
            CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\n%s");
            if (CVar6 != CURLE_OK) goto joined_r0x0051249d;
          }
          CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\n\r\n");
          if (CVar6 != CURLE_OK) goto joined_r0x0051249d;
          uVar1 = post->flags;
          if ((uVar1 & 3) == 0) {
            if ((uVar1 & 0x10) == 0) {
              pcVar11 = local_2a0;
              if (-1 < (char)uVar1) {
                pcVar11 = local_2a8;
              }
              length_00 = *pcVar11;
              if ((uVar1 & 0x40) != 0) {
                CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
                if ((-1 < length_00) && (-1 < local_2d0)) {
                  pcVar10 = (char *)post->userp;
                  pFVar9 = (FormData *)(*Curl_cmalloc)(0x20);
                  if (pFVar9 != (FormData *)0x0) {
                    pFVar9->next = (FormData *)0x0;
                    pFVar9->line = pcVar10;
                    pFVar9->type = FORM_CALLBACK;
                    local_2d0 = local_2d0 + length_00;
                    if (local_2c8 != (FormData *)0x0) {
                      local_2c8->next = pFVar9;
                    }
                    CVar6 = CURLE_OK;
                    local_2c8 = pFVar9;
                    goto LAB_00512420;
                  }
                  CVar6 = CURLE_OUT_OF_MEMORY;
                }
                goto joined_r0x0051249d;
              }
              pcVar10 = post->contents;
              type = FORM_CONTENT;
            }
            else {
              pcVar10 = post->buffer;
              length_00 = post->bufferlength;
              type = FORM_CONTENT;
            }
LAB_0051239a:
            CVar6 = AddFormData(&local_2c8,type,pcVar10,length_00,&local_2d0);
          }
          else {
            __filename = (byte *)pcVar12->contents;
            uVar7 = *__filename - 0x2d;
            if (uVar7 == 0) {
              uVar7 = (uint)__filename[1];
            }
            __stream = _stdin;
            if (uVar7 != 0) {
              __stream = fopen64((char *)__filename,"rb");
            }
            if (__stream == (FILE *)0x0) {
              if (local_2b8 != (Curl_easy *)0x0) {
                Curl_failf(local_2b8,"couldn\'t open file \"%s\"",pcVar12->contents);
              }
              *local_2c0 = (FormData *)0x0;
              CVar6 = CURLE_READ_ERROR;
              goto joined_r0x0051249d;
            }
            if (__stream != _stdin) {
              fclose(__stream);
              pcVar10 = pcVar12->contents;
              type = FORM_FILE;
              length_00 = 0;
              goto LAB_0051239a;
            }
            do {
              length = fread(local_238,1,0x200,__stream);
              CVar5 = CURLE_OK;
              CVar6 = CVar5;
              if (((length == 0) ||
                  (CVar6 = AddFormData(&local_2c8,FORM_CONTENT,local_238,length,&local_2d0),
                  CVar6 != CURLE_OK)) || (iVar8 = feof(__stream), CVar6 = CVar5, iVar8 != 0)) break;
              iVar8 = ferror(__stream);
            } while (iVar8 == 0);
          }
LAB_00512420:
        } while ((CVar6 == CURLE_OK) && (pcVar12 = pcVar12->more, pcVar12 != (curl_httppost *)0x0));
        if ((CVar6 != CURLE_OK) ||
           ((post->more != (curl_httppost *)0x0 &&
            (CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\n--%s--",&local_298), CVar6 != CURLE_OK)
            ))) goto joined_r0x0051249d;
        plVar4 = local_2b0;
        ppFVar3 = local_2c0;
        post = post->next;
        finalform = local_2c0;
      } while (post != (curl_httppost *)0x0);
      CVar5 = CURLE_OK;
      CVar6 = AddFormDataf(&local_2c8,&local_2d0,"\r\n--%s--\r\n",&local_268);
      if (CVar6 == CURLE_OK) {
        *plVar4 = local_2d0;
        *ppFVar3 = pFVar2;
      }
      else {
joined_r0x0051249d:
        while (CVar5 = CVar6, pFVar2 != (FormData *)0x0) {
          pFVar9 = pFVar2->next;
          if (pFVar2->type < FORM_CALLBACK) {
            (*Curl_cfree)(pFVar2->line);
          }
          (*Curl_cfree)(pFVar2);
          pFVar2 = pFVar9;
          CVar6 = CVar5;
        }
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_getformdata(struct Curl_easy *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;
  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char fileboundary[42];
  struct curl_slist *curList;
  char boundary[42];

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  result = formboundary(data, boundary, sizeof(boundary));
  if(result)
    return result;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      result = formboundary(data, fileboundary, sizeof(fileboundary));
      if(result) {
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf(&form, &size, "\r\n%s", curList->data);
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = !strcmp("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result || feof(fileread) || ferror(fileread))
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size is set
           with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->flags&CURL_HTTPPOST_LARGE?
                             post->contentlen:post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->flags&CURL_HTTPPOST_LARGE?
                             post->contentlen:post->contentslength, &size);
      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }
    post = post->next;
  } while(post); /* for each field */

  /* end-boundary for everything */
  if(!result)
    result = AddFormDataf(&form, &size, "\r\n--%s--\r\n", boundary);

  if(result) {
    Curl_formclean(&firstform);
    return result;
  }

  *sizep = size;
  *finalform = firstform;

  return result;
}